

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpt-op.c
# Opt level: O0

int gpt_probe_label(hd_context *ctx,gpt_disk *disk)

{
  int iVar1;
  __uint32_t _Var2;
  gpt_header *pgVar3;
  int mbr_type;
  gpt_disk *disk_local;
  hd_context *ctx_local;
  
  iVar1 = valid_pmbr(disk);
  if (iVar1 == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    pgVar3 = gpt_read_header(disk,1,&disk->ents);
    disk->pheader = pgVar3;
    if (disk->pheader == (gpt_header *)0x0) {
      ctx_local._4_4_ = 0;
    }
    else {
      _Var2 = __uint32_identity(disk->pheader->npartition_entries);
      (disk->super).nparts_max = (ulong)_Var2;
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int gpt_probe_label(hd_context *ctx, gpt_disk *disk)
{
    int mbr_type;
    mbr_type = valid_pmbr(disk);
    if (!mbr_type)
        return 0;

    /* primary header */
    disk->pheader = gpt_read_header(disk, GPT_PRIMARY_PARTITION_TABLE_LBA,
                                   &disk->ents);

    /*TODO: bheader also needs to be read */
    if (!disk->pheader)
        return 0;

    disk->super.nparts_max = le32_to_cpu(disk->pheader->npartition_entries);

    return 1;
}